

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::paint(QHexView *this,QPainter *painter)

{
  int iVar1;
  QTextCursor c;
  QTextDocument doc;
  QTextCursor local_50 [8];
  QTextDocument local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  QTextDocument::QTextDocument(local_48,(QObject *)0x0);
  QTextDocument::setDocumentMargin(0.0);
  QTextDocument::setUndoRedoEnabled(SUB81(local_48,0));
  QTextDocument::setDefaultFont((QFont *)local_48);
  QTextCursor::QTextCursor(local_50,local_48);
  drawHeader(this,local_50);
  drawDocument(this,local_50);
  QAbstractScrollArea::horizontalScrollBar();
  iVar1 = QAbstractSlider::value();
  QPainter::translate(painter,(double)-iVar1,0.0);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  QTextDocument::drawContents((QPainter *)local_48,(QRectF *)painter);
  drawSeparators(this,painter);
  QTextCursor::~QTextCursor(local_50);
  QTextDocument::~QTextDocument(local_48);
  return;
}

Assistant:

void QHexView::paint(QPainter* painter) const {
    QTextDocument doc;
    doc.setDocumentMargin(0);
    doc.setUndoRedoEnabled(false);
    doc.setDefaultFont(this->font());

    QTextCursor c(&doc);

    this->drawHeader(c);
    this->drawDocument(c);

    painter->translate(-this->horizontalScrollBar()->value(), 0);
    doc.drawContents(painter);
    this->drawSeparators(painter);
}